

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

void __thiscall
cmTestGenerator::GenerateScriptActions(cmTestGenerator *this,ostream *os,Indent *indent)

{
  pointer pbVar1;
  pointer pcVar2;
  cmTest *pcVar3;
  char cVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  int iVar7;
  _Rb_tree_header *p_Var8;
  char *pcVar9;
  pointer pbVar10;
  string sStack_b0;
  allocator aStack_89;
  Indent *pIStack_88;
  cmTestGenerator *pcStack_80;
  cmTest *pcStack_78;
  string sStack_70;
  string sStack_50;
  
  if ((this->super_cmScriptGenerator).ActionsPerConfig == true) {
    cmScriptGenerator::GenerateScriptActions(&this->super_cmScriptGenerator,os,indent);
    return;
  }
  this->TestGenerated = true;
  pcStack_78 = this->Test;
  pbVar10 = (pcStack_78->Command).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sStack_70._M_dataplus._M_p = (pointer)&sStack_70.field_2;
  pcVar2 = (pbVar10->_M_dataplus)._M_p;
  pIStack_88 = indent;
  pcStack_80 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_70,pcVar2,pcVar2 + pbVar10->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&sStack_70);
  if (0 < pIStack_88->Level) {
    iVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      iVar7 = iVar7 + 1;
    } while (iVar7 < pIStack_88->Level);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"add_test(",9);
  sStack_b0._M_dataplus._M_p = (pointer)&sStack_b0.field_2;
  pcVar2 = (pcStack_80->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_b0,pcVar2,pcVar2 + (pcStack_80->Test->Name)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,sStack_b0._M_dataplus._M_p,sStack_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," \"",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,sStack_70._M_dataplus._M_p,sStack_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_b0._M_dataplus._M_p != &sStack_b0.field_2) {
    operator_delete(sStack_b0._M_dataplus._M_p,sStack_b0.field_2._M_allocated_capacity + 1);
  }
  pbVar10 = (pcStack_78->Command).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar1 = pbVar10 + 1,
        pbVar1 != (pcStack_78->Command).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(os," \"",2);
    if (pbVar10[1]._M_string_length != 0) {
      pcVar9 = (pbVar1->_M_dataplus)._M_p;
      do {
        cVar4 = *pcVar9;
        if (cVar4 == '\"') {
          sStack_b0._M_dataplus._M_p._0_1_ = 0x5c;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&sStack_b0,1);
          cVar4 = *pcVar9;
        }
        sStack_b0._M_dataplus._M_p._0_1_ = cVar4;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&sStack_b0,1);
        pcVar9 = pcVar9 + 1;
      } while (pcVar9 != pbVar10[1]._M_dataplus._M_p + pbVar10[1]._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
    pbVar10 = pbVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  cVar4 = (char)os;
  std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  pcVar3 = pcStack_80->Test;
  if ((pcVar3->Properties).
      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if (0 < pIStack_88->Level) {
      iVar7 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar7 = iVar7 + 1;
      } while (iVar7 < pIStack_88->Level);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties(",0x15);
    sStack_b0._M_dataplus._M_p = (pointer)&sStack_b0.field_2;
    pcVar2 = (pcStack_80->Test->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_b0,pcVar2,pcVar2 + (pcStack_80->Test->Name)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,sStack_b0._M_dataplus._M_p,sStack_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTIES ",0xc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != &sStack_b0.field_2) {
      operator_delete(sStack_b0._M_dataplus._M_p,sStack_b0.field_2._M_allocated_capacity + 1);
    }
    p_Var6 = (pcVar3->Properties).
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var8 = &(pcVar3->Properties).
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var8) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        pcVar9 = cmProperty::GetValue((cmProperty *)(p_Var6 + 2));
        std::__cxx11::string::string((string *)&sStack_50,pcVar9,&aStack_89);
        cmOutputConverter::EscapeForCMake(&sStack_b0,&sStack_50);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,sStack_b0._M_dataplus._M_p,sStack_b0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_b0._M_dataplus._M_p != &sStack_b0.field_2) {
          operator_delete(sStack_b0._M_dataplus._M_p,sStack_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_50._M_dataplus._M_p != &sStack_50.field_2) {
          operator_delete(sStack_50._M_dataplus._M_p,sStack_50.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
    std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_70._M_dataplus._M_p != &sStack_70.field_2) {
    operator_delete(sStack_70._M_dataplus._M_p,sStack_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptActions(std::ostream& os,
                                            Indent const& indent)
{
  if(this->ActionsPerConfig)
    {
    // This is the per-config generation in a single-configuration
    // build generator case.  The superclass will call our per-config
    // method.
    this->cmScriptGenerator::GenerateScriptActions(os, indent);
    }
  else
    {
    // This is an old-style test, so there is only one config.
    //assert(this->Test->GetOldStyle());
    this->GenerateOldStyle(os, indent);
    }
}